

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_setup_outgoing_command(ENetPeer *peer,ENetOutgoingCommand *outgoingCommand)

{
  byte bVar1;
  uint16_t uVar2;
  ENetChannel *pEVar3;
  size_t sVar4;
  ENetChannel *channel;
  ENetOutgoingCommand *outgoingCommand_local;
  ENetPeer *peer_local;
  
  pEVar3 = peer->channels + (outgoingCommand->command).header.channelID;
  sVar4 = enet_protocol_command_size((outgoingCommand->command).header.command);
  peer->outgoingDataTotal =
       peer->outgoingDataTotal + (int)sVar4 + (uint)outgoingCommand->fragmentLength;
  if ((outgoingCommand->command).header.channelID == 0xff) {
    peer->outgoingReliableSequenceNumber = peer->outgoingReliableSequenceNumber + 1;
    outgoingCommand->reliableSequenceNumber = peer->outgoingReliableSequenceNumber;
    outgoingCommand->unreliableSequenceNumber = 0;
  }
  else if (((outgoingCommand->command).header.command & 0x80) == 0) {
    if (((outgoingCommand->command).header.command & 0x40) == 0) {
      if (outgoingCommand->fragmentOffset == 0) {
        pEVar3->outgoingUnreliableSequenceNumber = pEVar3->outgoingUnreliableSequenceNumber + 1;
      }
      outgoingCommand->reliableSequenceNumber = pEVar3->outgoingReliableSequenceNumber;
      outgoingCommand->unreliableSequenceNumber = pEVar3->outgoingUnreliableSequenceNumber;
    }
    else {
      peer->outgoingUnsequencedGroup = peer->outgoingUnsequencedGroup + 1;
      outgoingCommand->reliableSequenceNumber = 0;
      outgoingCommand->unreliableSequenceNumber = 0;
    }
  }
  else {
    pEVar3->outgoingReliableSequenceNumber = pEVar3->outgoingReliableSequenceNumber + 1;
    pEVar3->outgoingUnreliableSequenceNumber = 0;
    outgoingCommand->reliableSequenceNumber = pEVar3->outgoingReliableSequenceNumber;
    outgoingCommand->unreliableSequenceNumber = 0;
  }
  outgoingCommand->sendAttempts = 0;
  outgoingCommand->sentTime = 0;
  outgoingCommand->roundTripTimeout = 0;
  outgoingCommand->roundTripTimeoutLimit = 0;
  uVar2 = htons(outgoingCommand->reliableSequenceNumber);
  (outgoingCommand->command).header.reliableSequenceNumber = uVar2;
  bVar1 = (outgoingCommand->command).header.command & 0xf;
  if (bVar1 == 7) {
    uVar2 = htons(outgoingCommand->unreliableSequenceNumber);
    (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber = uVar2;
  }
  else if (bVar1 == 9) {
    uVar2 = htons(peer->outgoingUnsequencedGroup);
    (outgoingCommand->command).acknowledge.receivedReliableSequenceNumber = uVar2;
  }
  enet_list_insert(&(peer->outgoingCommands).sentinel,outgoingCommand);
  return;
}

Assistant:

void
enet_peer_setup_outgoing_command (ENetPeer * peer, ENetOutgoingCommand * outgoingCommand)
{
    ENetChannel * channel = & peer -> channels [outgoingCommand -> command.header.channelID];
    
    peer -> outgoingDataTotal += enet_protocol_command_size (outgoingCommand -> command.header.command) + outgoingCommand -> fragmentLength;

    if (outgoingCommand -> command.header.channelID == 0xFF)
    {
       ++ peer -> outgoingReliableSequenceNumber;

       outgoingCommand -> reliableSequenceNumber = peer -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_ACKNOWLEDGE)
    {
       ++ channel -> outgoingReliableSequenceNumber;
       channel -> outgoingUnreliableSequenceNumber = 0;

       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    if (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED)
    {
       ++ peer -> outgoingUnsequencedGroup;

       outgoingCommand -> reliableSequenceNumber = 0;
       outgoingCommand -> unreliableSequenceNumber = 0;
    }
    else
    {
       if (outgoingCommand -> fragmentOffset == 0)
         ++ channel -> outgoingUnreliableSequenceNumber;
        
       outgoingCommand -> reliableSequenceNumber = channel -> outgoingReliableSequenceNumber;
       outgoingCommand -> unreliableSequenceNumber = channel -> outgoingUnreliableSequenceNumber;
    }
   
    outgoingCommand -> sendAttempts = 0;
    outgoingCommand -> sentTime = 0;
    outgoingCommand -> roundTripTimeout = 0;
    outgoingCommand -> roundTripTimeoutLimit = 0;
    outgoingCommand -> command.header.reliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> reliableSequenceNumber);

    switch (outgoingCommand -> command.header.command & ENET_PROTOCOL_COMMAND_MASK)
    {
    case ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE:
        outgoingCommand -> command.sendUnreliable.unreliableSequenceNumber = ENET_HOST_TO_NET_16 (outgoingCommand -> unreliableSequenceNumber);
        break;

    case ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED:
        outgoingCommand -> command.sendUnsequenced.unsequencedGroup = ENET_HOST_TO_NET_16 (peer -> outgoingUnsequencedGroup);
        break;
    
    default:
        break;
    }

    enet_list_insert (enet_list_end (& peer -> outgoingCommands), outgoingCommand);
}